

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

Bucket * __thiscall rengine::Signal<int>::findBucket(Signal<int> *this,SignalEmitter *emitter)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  Bucket *pBVar2;
  pointer ppBVar3;
  
  pvVar1 = emitter->m_buckets;
  if (pvVar1 == (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)0x0) {
    return (Bucket *)0x0;
  }
  ppBVar3 = (pvVar1->
            super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppBVar3 ==
        (pvVar1->
        super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return (Bucket *)0x0;
    }
    pBVar2 = (Bucket *)*ppBVar3;
    ppBVar3 = ppBVar3 + 1;
  } while ((pBVar2->super_BucketBase).signal != &this->super_SignalBase);
  return pBVar2;
}

Assistant:

Bucket *findBucket(SignalEmitter *emitter) const
    {
        if (!emitter->m_buckets)
            return 0;
        for (SignalEmitter::BucketBase *bucket : *emitter->m_buckets) {
            if (bucket->signal == this)
                return static_cast<Bucket *>(bucket);
        }
        return 0;
    }